

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

ostream * Catch::operator<<(ostream *os,LazyExpression *lazyExpr)

{
  ITransientExpression *pIVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char local_1b [3];
  
  if (lazyExpr->m_isNegated == true) {
    local_1b[0] = '!';
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1b,1);
  }
  pIVar1 = lazyExpr->m_transientExpression;
  if (pIVar1 == (ITransientExpression *)0x0) {
    pcVar4 = "{** error - unchecked empty expression requested **}";
    lVar3 = 0x34;
    poVar2 = os;
  }
  else {
    if ((lazyExpr->m_isNegated != true) || (pIVar1->m_isBinaryExpression != true)) {
      (**pIVar1->_vptr_ITransientExpression)(pIVar1,os);
      return os;
    }
    local_1b[1] = 0x28;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_1b + 1,1);
    (**lazyExpr->m_transientExpression->_vptr_ITransientExpression)
              (lazyExpr->m_transientExpression,poVar2);
    pcVar4 = local_1b + 2;
    local_1b[2] = 0x29;
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  return os;
}

Assistant:

auto operator << (std::ostream& os, LazyExpression const& lazyExpr) -> std::ostream& {
        if (lazyExpr.m_isNegated)
            os << '!';

        if (lazyExpr) {
            if (lazyExpr.m_isNegated && lazyExpr.m_transientExpression->isBinaryExpression())
                os << '(' << *lazyExpr.m_transientExpression << ')';
            else
                os << *lazyExpr.m_transientExpression;
        } else {
            os << "{** error - unchecked empty expression requested **}";
        }
        return os;
    }